

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O3

void CheckSceneAverage(string *filename,float expected)

{
  bool bVar1;
  Allocator alloc;
  undefined8 uVar2;
  int c;
  int c_00;
  char *pcVar3;
  char *in_R9;
  ulong uVar4;
  long lVar5;
  Float FVar6;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  optional<pbrt::ImageAndMetadata> im;
  int in_stack_fffffffffffffb58;
  int iVar7;
  undefined4 in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb64;
  Message local_498;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  abs_error;
  AssertHelper in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  ColorEncodingHandle local_470;
  undefined1 local_468 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  polymorphic_allocator<unsigned_char> local_3b0;
  uchar *local_3a8;
  size_t local_3a0;
  size_t local_398;
  polymorphic_allocator<pbrt::Half> local_390;
  Half *local_388;
  size_t local_380;
  size_t local_378;
  polymorphic_allocator<float> local_370;
  float *local_368;
  size_t local_360;
  size_t local_358;
  bool local_34c;
  bool local_308;
  bool local_2c4;
  bool local_2b0;
  bool local_2a4;
  bool local_29c;
  bool local_294;
  bool local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_280;
  optional<pbrt::ImageAndMetadata> local_250;
  
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_470.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read((ImageAndMetadata *)local_468,filename,alloc,&local_470);
  local_250.set = true;
  pbrt::ImageAndMetadata::ImageAndMetadata
            ((ImageAndMetadata *)&local_250,(ImageAndMetadata *)local_468);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_280);
  if (local_288 == true) {
    local_288 = false;
  }
  if (local_294 == true) {
    local_294 = false;
  }
  if (local_29c == true) {
    local_29c = false;
  }
  if (local_2a4 == true) {
    local_2a4 = false;
  }
  if (local_2b0 == true) {
    local_2b0 = false;
  }
  if (local_2c4 == true) {
    local_2c4 = false;
  }
  if (local_308 == true) {
    local_308 = false;
  }
  if (local_34c == true) {
    local_34c = false;
  }
  local_358 = 0;
  (*(local_370.memoryResource)->_vptr_memory_resource[3])
            (local_370.memoryResource,local_368,local_360 << 2,4);
  local_378 = 0;
  (*(local_390.memoryResource)->_vptr_memory_resource[3])
            (local_390.memoryResource,local_388,local_380 * 2,2);
  local_398 = 0;
  (*(local_3b0.memoryResource)->_vptr_memory_resource[3])
            (local_3b0.memoryResource,local_3a8,local_3a0,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_458);
  local_498.ss_.ptr_._0_4_ = CONCAT31(local_498.ss_.ptr_._1_3_,local_250.set);
  abs_error.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_250.set == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffb58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_468,(internal *)&local_498,(AssertionResult *)"(bool)im","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffb78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators_test.cpp"
               ,0x34,(char *)CONCAT71(local_468._1_7_,local_468[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffb78,(Message *)&stack0xfffffffffffffb58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb78);
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(local_468._1_7_,local_468[0]) != &local_458) {
      operator_delete((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT71(local_468._1_7_,local_468[0]),
                      (ulong)((long)local_458.alloc.memoryResource + 1));
    }
    if (((CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58) != 0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((long *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58) + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xfffffffffffffb70,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xfffffffffffffb70,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_250.set == false) {
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
    }
    iVar7 = 3;
    local_498.ss_.ptr_._0_4_ = local_250.optionalValue._168_4_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_468,"im->image.NChannels()","3",(int *)&local_498,
               (int *)&stack0xfffffffffffffb58);
    if (local_468[0] == (internal)0x0) {
      testing::Message::Message(&local_498);
      if ((undefined8 *)local_468._8_8_ == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_468._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffb58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators_test.cpp"
                 ,0x35,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffb58,&local_498);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb58);
      if (((CONCAT44(local_498.ss_.ptr_._4_4_,local_498.ss_.ptr_._0_4_) != 0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         ((long *)CONCAT44(local_498.ss_.ptr_._4_4_,local_498.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_498.ss_.ptr_._4_4_,local_498.ss_.ptr_._0_4_) + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_468 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_468 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_250.set != true) {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
      }
      if (0 < (int)((ulong)local_250.optionalValue._4_8_ >> 0x20)) {
        lVar5 = 0;
        in_stack_fffffffffffffb64 = 0.0;
        uVar2 = local_250.optionalValue._4_8_;
        do {
          if (0 < (int)uVar2) {
            uVar4 = 0;
            do {
              c_00 = 0;
              do {
                FVar6 = pbrt::Image::GetChannel
                                  ((Image *)&local_250,(Point2i)(lVar5 << 0x20 | uVar4),c_00,
                                   (WrapMode2D)0x200000002);
                c_00 = c_00 + 1;
                in_stack_fffffffffffffb64 = in_stack_fffffffffffffb64 + FVar6;
              } while (c_00 != 3);
              uVar4 = uVar4 + 1;
              uVar2 = local_250.optionalValue._4_8_;
            } while ((long)uVar4 < (long)(int)local_250.optionalValue._4_8_);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (long)uVar2 >> 0x20);
      }
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (char *)CONCAT44(in_stack_fffffffffffffb5c,iVar7),(char *)0x2e5903,
                 (double)CONCAT44(expected,in_stack_fffffffffffffb80),
                 (double)in_stack_fffffffffffffb78.data_,(double)abs_error.ptr_);
      if (local_468[0] == (internal)0x0) {
        testing::Message::Message(&local_498);
        if ((undefined8 *)local_468._8_8_ == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_468._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffb58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators_test.cpp"
                   ,0x40,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffb58,&local_498);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb58);
        if (((CONCAT44(local_498.ss_.ptr_._4_4_,local_498.ss_.ptr_._0_4_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(local_498.ss_.ptr_._4_4_,local_498.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_498.ss_.ptr_._4_4_,local_498.ss_.ptr_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_468 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  pstd::optional<pbrt::ImageAndMetadata>::reset(&local_250);
  return;
}

Assistant:

void CheckSceneAverage(const std::string &filename, float expected) {
    pstd::optional<ImageAndMetadata> im = Image::Read(filename);
    ASSERT_TRUE((bool)im);
    ASSERT_EQ(im->image.NChannels(), 3);

    float delta = .025;
    float sum = 0;

    Image &image = im->image;
    for (int t = 0; t < image.Resolution()[1]; ++t)
        for (int s = 0; s < image.Resolution()[0]; ++s)
            for (int c = 0; c < 3; ++c)
                sum += image.GetChannel(Point2i(s, t), c);
    int nPixels = image.Resolution().x * image.Resolution().y * 3;
    EXPECT_NEAR(expected, sum / nPixels, delta);
}